

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

float distance(Point *a,Point *b)

{
  float fVar1;
  Point local_18;
  
  local_18 = operator-(*b,a);
  fVar1 = vectorLen(&local_18);
  return fVar1;
}

Assistant:

float distance(Point const& a, Point const& b)
{
  return vectorLen(b - a);
}